

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::WriteSubProjects
          (cmGlobalGhsMultiGenerator *this,ostream *fout,bool filterPredefined)

{
  char *__s;
  bool bVar1;
  int iVar2;
  TargetType TVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference ppcVar4;
  string *psVar5;
  undefined4 extraout_var_01;
  ostream *poVar6;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  _Self local_138;
  _Self local_130;
  undefined1 local_121;
  cmGeneratorTarget *pcStack_120;
  bool predefinedTarget;
  cmGeneratorTarget *target;
  iterator __end1;
  iterator __begin1;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range1;
  allocator<char> local_e9;
  value_type local_e8;
  _Base_ptr local_c8;
  undefined1 local_c0;
  allocator<char> local_b1;
  value_type local_b0;
  _Base_ptr local_90;
  undefined1 local_88;
  allocator<char> local_7d [13];
  value_type local_70;
  undefined1 local_50 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  predefinedTargets;
  bool filterPredefined_local;
  ostream *fout_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  predefinedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = filterPredefined;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_50);
  iVar2 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1c])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,(char *)CONCAT44(extraout_var,iVar2),local_7d);
  pVar7 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50,&local_70);
  local_90 = (_Base_ptr)pVar7.first._M_node;
  local_88 = pVar7.second;
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(local_7d);
  iVar2 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1b])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,(char *)CONCAT44(extraout_var_00,iVar2),&local_b1);
  pVar7 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50,&local_b0);
  local_c8 = (_Base_ptr)pVar7.first._M_node;
  local_c0 = pVar7.second;
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  __s = CHECK_BUILD_SYSTEM_TARGET;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,__s,&local_e9);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  __end1 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::begin
                     (&this->ProjectTargets);
  target = (cmGeneratorTarget *)
           std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::end
                     (&this->ProjectTargets);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                *)&target);
    if (!bVar1) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50);
      return;
    }
    ppcVar4 = __gnu_cxx::
              __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
              ::operator*(&__end1);
    pcStack_120 = *ppcVar4;
    TVar3 = cmGeneratorTarget::GetType(pcStack_120);
    if (((TVar3 != INTERFACE_LIBRARY) &&
        (TVar3 = cmGeneratorTarget::GetType(pcStack_120), TVar3 != MODULE_LIBRARY)) &&
       (TVar3 = cmGeneratorTarget::GetType(pcStack_120), TVar3 != SHARED_LIBRARY)) {
      TVar3 = cmGeneratorTarget::GetType(pcStack_120);
      if (TVar3 == GLOBAL_TARGET) {
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(pcStack_120);
        iVar2 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1c])();
        bVar1 = std::operator!=(psVar5,(char *)CONCAT44(extraout_var_01,iVar2));
        if (bVar1) goto LAB_007830dc;
      }
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(pcStack_120);
      local_130._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50,psVar5);
      local_138._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50);
      local_121 = std::operator!=(&local_130,&local_138);
      if ((((predefinedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) &&
          ((bool)local_121)) ||
         (((predefinedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0 &&
          (!(bool)local_121)))) {
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(pcStack_120);
        std::operator+(&local_178,psVar5,".tgt");
        std::operator+(&local_158,&local_178,FILE_EXTENSION);
        poVar6 = std::operator<<(fout,(string *)&local_158);
        std::operator<<(poVar6," [Project]\n");
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
      }
    }
LAB_007830dc:
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteSubProjects(std::ostream& fout,
                                                 bool filterPredefined)
{
  std::set<std::string> predefinedTargets;
  predefinedTargets.insert(this->GetInstallTargetName());
  predefinedTargets.insert(this->GetAllTargetName());
  predefinedTargets.insert(std::string(CHECK_BUILD_SYSTEM_TARGET));

  // All known targets
  for (cmGeneratorTarget const* target : this->ProjectTargets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
         target->GetName() != this->GetInstallTargetName())) {
      continue;
    }
    /* Check if the current target is a predefined CMake target */
    bool predefinedTarget =
      predefinedTargets.find(target->GetName()) != predefinedTargets.end();
    if ((filterPredefined && predefinedTarget) ||
        (!filterPredefined && !predefinedTarget)) {
      fout << target->GetName() + ".tgt" + FILE_EXTENSION << " [Project]\n";
    }
  }
}